

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_FinishConfigure
                  (PaAlsaStreamComponent *self,snd_pcm_hw_params_t *hwParams,
                  PaStreamParameters *params,int primeBuffers,double sampleRate,PaTime *latency)

{
  snd_pcm_t *psVar1;
  snd_pcm_uframes_t sVar2;
  long lVar3;
  int iVar4;
  size_t __n;
  long lVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar6;
  char *errorText;
  char *format;
  undefined1 *__s;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  ulong local_50;
  undefined8 local_48;
  snd_pcm_uframes_t boundary;
  int local_34;
  
  *latency = -1.0;
  uStack_60 = 0x111935;
  boundary = (snd_pcm_uframes_t)sampleRate;
  local_34 = primeBuffers;
  __n = snd_pcm_sw_params_sizeof();
  lVar3 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_58 + lVar3;
  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111953;
  memset(__s,0,__n);
  auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)self->framesPerPeriod);
  auVar8._8_4_ = (int)(self->framesPerPeriod >> 0x20);
  auVar8._12_4_ = 0x45300000;
  dVar7 = params->suggestedLatency * (double)boundary +
          (auVar8._8_8_ - 1.9342813113834067e+25) + (auVar8._0_8_ - 4503599627370496.0);
  local_50 = (ulong)dVar7;
  local_50 = (long)(dVar7 - 9.223372036854776e+18) & (long)local_50 >> 0x3f | local_50;
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x1119b4;
  iVar4 = snd_pcm_hw_params_set_buffer_size_near(psVar1,hwParams);
  if (iVar4 < 0) {
    *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b26;
    PaAlsaStreamComponent_FinishConfigure_cold_13();
  }
  else {
    psVar1 = self->pcm;
    *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x1119c8;
    iVar4 = snd_pcm_hw_params(psVar1,hwParams);
    if (iVar4 < 0) {
      *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b32;
      PaAlsaStreamComponent_FinishConfigure_cold_12();
    }
    else {
      if (alsa_snd_pcm_hw_params_get_buffer_size == (undefined1 *)0x0) {
        self->alsaBufferSize = local_50;
        uVar6 = local_50;
      }
      else {
        *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x1119e9;
        iVar4 = snd_pcm_hw_params_get_buffer_size(hwParams,&self->alsaBufferSize);
        if (iVar4 < 0) {
          *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b84;
          PaAlsaStreamComponent_FinishConfigure_cold_1();
          return -9999;
        }
        uVar6 = self->alsaBufferSize;
      }
      lVar5 = uVar6 - self->framesPerPeriod;
      auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar9._0_8_ = lVar5;
      auVar9._12_4_ = 0x45300000;
      *latency = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / (double)boundary;
      psVar1 = self->pcm;
      *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111a3a;
      iVar4 = snd_pcm_sw_params_current(psVar1,__s);
      if (iVar4 < 0) {
        *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b3e;
        PaAlsaStreamComponent_FinishConfigure_cold_11();
      }
      else {
        psVar1 = self->pcm;
        sVar2 = self->framesPerPeriod;
        *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111a52;
        iVar4 = snd_pcm_sw_params_set_start_threshold(psVar1,__s,sVar2);
        if (iVar4 < 0) {
          *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b4a;
          PaAlsaStreamComponent_FinishConfigure_cold_10();
        }
        else {
          psVar1 = self->pcm;
          sVar2 = self->alsaBufferSize;
          *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111a6a;
          iVar4 = snd_pcm_sw_params_set_stop_threshold(psVar1,__s,sVar2);
          if (iVar4 < 0) {
            *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b56;
            PaAlsaStreamComponent_FinishConfigure_cold_9();
          }
          else {
            if (local_34 == 0) {
              *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111a84;
              iVar4 = snd_pcm_sw_params_get_boundary(__s,&local_48);
              if (iVar4 < 0) {
                format = 
                "Expression \'alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2182\n"
                ;
                *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b95;
                PaAlsaStreamComponent_FinishConfigure_cold_2();
                uVar6 = extraout_RAX;
LAB_00111bb7:
                if ((uVar6 & 1) == 0) {
                  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111bc6;
                  errorText = (char *)snd_strerror(iVar4);
                  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111bd6;
                  PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar4,errorText);
                }
                *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111be0;
                PaUtil_DebugPrint(format);
              }
              psVar1 = self->pcm;
              *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111a9a;
              iVar4 = snd_pcm_sw_params_set_silence_threshold(psVar1,__s,0);
              if (iVar4 < 0) {
                format = 
                "Expression \'alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2183\n"
                ;
                *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111ba6;
                PaAlsaStreamComponent_FinishConfigure_cold_3();
                uVar6 = extraout_RAX_00;
                goto LAB_00111bb7;
              }
              psVar1 = self->pcm;
              *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111ab2;
              iVar4 = snd_pcm_sw_params_set_silence_size(psVar1,__s,local_48);
              if (iVar4 < 0) {
                format = 
                "Expression \'alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2184\n"
                ;
                *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111bb7;
                PaAlsaStreamComponent_FinishConfigure_cold_8();
                uVar6 = extraout_RAX_01;
                goto LAB_00111bb7;
              }
            }
            psVar1 = self->pcm;
            sVar2 = self->framesPerPeriod;
            *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111aca;
            iVar4 = snd_pcm_sw_params_set_avail_min(psVar1,__s,sVar2);
            if (iVar4 < 0) {
              *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b62;
              PaAlsaStreamComponent_FinishConfigure_cold_7();
            }
            else {
              psVar1 = self->pcm;
              *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111ae3;
              iVar4 = snd_pcm_sw_params_set_xfer_align(psVar1,__s,1);
              if (iVar4 < 0) {
                *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b6b;
                PaAlsaStreamComponent_FinishConfigure_cold_6();
              }
              else {
                psVar1 = self->pcm;
                *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111af8;
                iVar4 = snd_pcm_sw_params_set_tstamp_mode(psVar1,__s,1);
                if (iVar4 < 0) {
                  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b74;
                  PaAlsaStreamComponent_FinishConfigure_cold_5();
                }
                else {
                  psVar1 = self->pcm;
                  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b08;
                  iVar4 = snd_pcm_sw_params(psVar1,__s);
                  if (-1 < iVar4) {
                    return 0;
                  }
                  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111b7b;
                  PaAlsaStreamComponent_FinishConfigure_cold_4();
                }
              }
            }
          }
        }
      }
    }
  }
  return -9999;
}

Assistant:

static PaError PaAlsaStreamComponent_FinishConfigure( PaAlsaStreamComponent *self, snd_pcm_hw_params_t* hwParams,
        const PaStreamParameters *params, int primeBuffers, double sampleRate, PaTime* latency )
{
    PaError result = paNoError;
    snd_pcm_sw_params_t* swParams;
    snd_pcm_uframes_t bufSz = 0;
    *latency = -1.;

    alsa_snd_pcm_sw_params_alloca( &swParams );

    bufSz = params->suggestedLatency * sampleRate + self->framesPerPeriod;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz ), paUnanticipatedHostError );

    /* Set the parameters! */
    {
        int r = alsa_snd_pcm_hw_params( self->pcm, hwParams );
#ifdef PA_ENABLE_DEBUG_OUTPUT
        if( r < 0 )
        {
            snd_output_t *output = NULL;
            alsa_snd_output_stdio_attach( &output, stderr, 0 );
            alsa_snd_pcm_hw_params_dump( hwParams, output );
        }
#endif
        ENSURE_( r, paUnanticipatedHostError );
    }
    if( alsa_snd_pcm_hw_params_get_buffer_size != NULL )
    {
        ENSURE_( alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize ), paUnanticipatedHostError );
    }
    else
    {
        self->alsaBufferSize = bufSz;
    }

    /* Latency in seconds */
    *latency = (self->alsaBufferSize - self->framesPerPeriod) / sampleRate;

    /* Now software parameters... */
    ENSURE_( alsa_snd_pcm_sw_params_current( self->pcm, swParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize ), paUnanticipatedHostError );

    /* Silence buffer in the case of underrun */
    if( !primeBuffers ) /* XXX: Make sense? */
    {
        snd_pcm_uframes_t boundary;
        ENSURE_( alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_MMAP ), paUnanticipatedHostError );

    /* Set the parameters! */
    ENSURE_( alsa_snd_pcm_sw_params( self->pcm, swParams ), paUnanticipatedHostError );

error:
    return result;
}